

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O0

void __thiscall
glslang::TIntermediate::mergeModes(TIntermediate *this,TInfoSink *infoSink,TIntermediate *unit)

{
  uint uVar1;
  TResourceType TVar2;
  bool bVar3;
  bool bVar4;
  EShSource EVar5;
  EShSource EVar6;
  int iVar7;
  uint *puVar8;
  int *piVar9;
  size_type sVar10;
  reference pvVar11;
  reference pvVar12;
  ulong uVar13;
  reference pvVar14;
  reference pvVar15;
  pointer ppVar16;
  iterator __first;
  iterator __last;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_70;
  const_iterator local_68;
  _Self local_60;
  _Self local_58;
  iterator it;
  uint i_2;
  uint i_1;
  size_t b;
  int local_38;
  int i;
  _Base_ptr local_30;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  TIntermediate *local_20;
  TIntermediate *unit_local;
  TInfoSink *infoSink_local;
  TIntermediate *this_local;
  
  local_20 = unit;
  unit_local = (TIntermediate *)infoSink;
  infoSink_local = (TInfoSink *)this;
  if (this->language != unit->language) {
    error(this,infoSink,"stages must match when linking into a single stage",EShLangCount);
  }
  EVar5 = getSource(this);
  if (EVar5 == EShSourceNone) {
    EVar5 = getSource(local_20);
    setSource(this,EVar5);
  }
  EVar5 = getSource(this);
  EVar6 = getSource(local_20);
  if (EVar5 != EVar6) {
    error(this,(TInfoSink *)unit_local,
          "can\'t link compilation units from different source languages",EShLangCount);
  }
  if (this->treeRoot == (TIntermNode *)0x0) {
    this->profile = local_20->profile;
    this->version = local_20->version;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&this->requestedExtensions,&local_20->requestedExtensions);
  }
  else {
    bVar4 = isEsProfile(this);
    bVar3 = isEsProfile(local_20);
    if (bVar4 == bVar3) {
      if (local_20->profile == ECompatibilityProfile) {
        this->profile = ECompatibilityProfile;
      }
    }
    else {
      error(this,(TInfoSink *)unit_local,"Cannot cross link ES and desktop profiles",EShLangCount);
    }
    piVar9 = std::max<int>(&this->version,&local_20->version);
    this->version = *piVar9;
    local_28._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(&local_20->requestedExtensions);
    local_30 = (_Base_ptr)
               std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(&local_20->requestedExtensions);
    std::
    set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::
    insert<std::_Rb_tree_const_iterator<std::__cxx11::string>>
              ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->requestedExtensions,local_28,
               (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )local_30);
  }
  puVar8 = std::max<unsigned_int>(&(this->spvVersion).spv,&(local_20->spvVersion).spv);
  (this->spvVersion).spv = *puVar8;
  piVar9 = std::max<int>(&(this->spvVersion).vulkanGlsl,&(local_20->spvVersion).vulkanGlsl);
  (this->spvVersion).vulkanGlsl = *piVar9;
  piVar9 = std::max<int>(&(this->spvVersion).vulkan,&(local_20->spvVersion).vulkan);
  (this->spvVersion).vulkan = *piVar9;
  piVar9 = std::max<int>(&(this->spvVersion).openGl,&(local_20->spvVersion).openGl);
  (this->spvVersion).openGl = *piVar9;
  if (((local_20->spvVersion).vulkanRelaxed & 1U) != 0) {
    (this->spvVersion).vulkanRelaxed = (bool)((local_20->spvVersion).vulkanRelaxed & 1);
  }
  iVar7 = getNumErrors(local_20);
  this->numErrors = iVar7 + this->numErrors;
  if ((1 < this->numPushConstants) || (1 < local_20->numPushConstants)) {
    error(this,(TInfoSink *)unit_local,"Only one push_constant block is allowed per stage",
          EShLangCount);
  }
  i = this->numPushConstants + local_20->numPushConstants;
  local_38 = 1;
  piVar9 = std::min<int>(&i,&local_38);
  this->numPushConstants = *piVar9;
  if (local_20->invocations != -1) {
    if (this->invocations == -1) {
      this->invocations = local_20->invocations;
    }
    else if (this->invocations != local_20->invocations) {
      error(this,(TInfoSink *)unit_local,
            "number of invocations must match between compilation units",EShLangCount);
    }
  }
  if (this->vertices == -1) {
    this->vertices = local_20->vertices;
  }
  else if ((local_20->vertices != -1) && (this->vertices != local_20->vertices)) {
    if ((this->language == EShLangGeometry) || (this->language == EShLangMesh)) {
      error(this,(TInfoSink *)unit_local,"Contradictory layout max_vertices values",EShLangCount);
    }
    else {
      if (this->language != EShLangTessControl) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/linkValidate.cpp"
                      ,0x157,"void glslang::TIntermediate::mergeModes(TInfoSink &, TIntermediate &)"
                     );
      }
      error(this,(TInfoSink *)unit_local,"Contradictory layout vertices values",EShLangCount);
    }
  }
  if (this->primitives == -1) {
    this->primitives = local_20->primitives;
  }
  else if (this->primitives != local_20->primitives) {
    if (this->language != EShLangMesh) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/linkValidate.cpp"
                    ,0x15f,"void glslang::TIntermediate::mergeModes(TInfoSink &, TIntermediate &)");
    }
    error(this,(TInfoSink *)unit_local,"Contradictory layout max_primitives values",EShLangCount);
  }
  if (this->inputPrimitive == ElgNone) {
    this->inputPrimitive = local_20->inputPrimitive;
  }
  else if ((local_20->inputPrimitive != ElgNone) &&
          (this->inputPrimitive != local_20->inputPrimitive)) {
    error(this,(TInfoSink *)unit_local,"Contradictory input layout primitives",EShLangCount);
  }
  if (this->outputPrimitive == ElgNone) {
    this->outputPrimitive = local_20->outputPrimitive;
  }
  else if ((local_20->outputPrimitive != ElgNone) &&
          (this->outputPrimitive != local_20->outputPrimitive)) {
    error(this,(TInfoSink *)unit_local,"Contradictory output layout primitives",EShLangCount);
  }
  if (((this->originUpperLeft & 1U) != (local_20->originUpperLeft & 1U)) ||
     ((this->pixelCenterInteger & 1U) != (local_20->pixelCenterInteger & 1U))) {
    error(this,(TInfoSink *)unit_local,"gl_FragCoord redeclarations must match across shaders",
          EShLangCount);
  }
  if (this->vertexSpacing == EvsNone) {
    this->vertexSpacing = local_20->vertexSpacing;
  }
  else if (this->vertexSpacing != local_20->vertexSpacing) {
    error(this,(TInfoSink *)unit_local,"Contradictory input vertex spacing",EShLangCount);
  }
  if (this->vertexOrder == EvoNone) {
    this->vertexOrder = local_20->vertexOrder;
  }
  else if (this->vertexOrder != local_20->vertexOrder) {
    error(this,(TInfoSink *)unit_local,"Contradictory triangle ordering",EShLangCount);
  }
  if ((local_20->pointMode & 1U) != 0) {
    this->pointMode = (bool)(local_20->pointMode & 1);
  }
  for (b._4_4_ = 0; b._4_4_ < 3; b._4_4_ = b._4_4_ + 1) {
    if ((local_20->localSizeNotDefault[b._4_4_] & 1U) != 0) {
      if ((this->localSizeNotDefault[b._4_4_] & 1U) == 0) {
        this->localSize[b._4_4_] = local_20->localSize[b._4_4_];
        this->localSizeNotDefault[b._4_4_] = true;
      }
      else if (this->localSize[b._4_4_] != local_20->localSize[b._4_4_]) {
        error(this,(TInfoSink *)unit_local,"Contradictory local size",EShLangCount);
      }
    }
    if (this->localSizeSpecId[b._4_4_] == -1) {
      this->localSizeSpecId[b._4_4_] = local_20->localSizeSpecId[b._4_4_];
    }
    else if (this->localSizeSpecId[b._4_4_] != local_20->localSizeSpecId[b._4_4_]) {
      error(this,(TInfoSink *)unit_local,"Contradictory local size specialization ids",EShLangCount)
      ;
    }
  }
  if ((local_20->earlyFragmentTests & 1U) != 0) {
    this->earlyFragmentTests = (bool)(local_20->earlyFragmentTests & 1);
  }
  if ((local_20->postDepthCoverage & 1U) != 0) {
    this->postDepthCoverage = (bool)(local_20->postDepthCoverage & 1);
  }
  if ((local_20->nonCoherentColorAttachmentReadEXT & 1U) != 0) {
    this->nonCoherentColorAttachmentReadEXT =
         (bool)(local_20->nonCoherentColorAttachmentReadEXT & 1);
  }
  if ((local_20->nonCoherentDepthAttachmentReadEXT & 1U) != 0) {
    this->nonCoherentDepthAttachmentReadEXT =
         (bool)(local_20->nonCoherentDepthAttachmentReadEXT & 1);
  }
  if ((local_20->nonCoherentStencilAttachmentReadEXT & 1U) != 0) {
    this->nonCoherentStencilAttachmentReadEXT =
         (bool)(local_20->nonCoherentStencilAttachmentReadEXT & 1);
  }
  if (this->depthLayout == EldNone) {
    this->depthLayout = local_20->depthLayout;
  }
  else if (this->depthLayout != local_20->depthLayout) {
    error(this,(TInfoSink *)unit_local,"Contradictory depth layouts",EShLangCount);
  }
  if ((local_20->depthReplacing & 1U) != 0) {
    this->depthReplacing = (bool)(local_20->depthReplacing & 1);
  }
  if ((local_20->hlslFunctionality1 & 1U) != 0) {
    this->hlslFunctionality1 = (bool)(local_20->hlslFunctionality1 & 1);
  }
  this->blendEquations = local_20->blendEquations | this->blendEquations;
  if ((local_20->xfbMode & 1U) != 0) {
    this->xfbMode = (bool)(local_20->xfbMode & 1);
  }
  for (_i_2 = 0;
      sVar10 = std::vector<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>::size
                         (&this->xfbBuffers), _i_2 < sVar10; _i_2 = _i_2 + 1) {
    pvVar11 = std::vector<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>::operator[]
                        (&this->xfbBuffers,_i_2);
    if (pvVar11->stride == 0x3fff) {
      pvVar11 = std::vector<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>::operator[]
                          (&local_20->xfbBuffers,_i_2);
      uVar1 = pvVar11->stride;
      pvVar11 = std::vector<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>::operator[]
                          (&this->xfbBuffers,_i_2);
      pvVar11->stride = uVar1;
    }
    else {
      pvVar11 = std::vector<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>::operator[]
                          (&this->xfbBuffers,_i_2);
      uVar1 = pvVar11->stride;
      pvVar11 = std::vector<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>::operator[]
                          (&local_20->xfbBuffers,_i_2);
      if (uVar1 != pvVar11->stride) {
        error(this,(TInfoSink *)unit_local,"Contradictory xfb_stride",EShLangCount);
      }
    }
    pvVar11 = std::vector<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>::operator[]
                        (&this->xfbBuffers,_i_2);
    pvVar12 = std::vector<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>::operator[]
                        (&local_20->xfbBuffers,_i_2);
    puVar8 = std::max<unsigned_int>(&pvVar11->implicitStride,&pvVar12->implicitStride);
    uVar1 = *puVar8;
    pvVar11 = std::vector<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>::operator[]
                        (&this->xfbBuffers,_i_2);
    pvVar11->implicitStride = uVar1;
    pvVar11 = std::vector<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>::operator[]
                        (&local_20->xfbBuffers,_i_2);
    if ((pvVar11->contains64BitType & 1U) != 0) {
      pvVar11 = std::vector<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>::operator[]
                          (&this->xfbBuffers,_i_2);
      pvVar11->contains64BitType = true;
    }
    pvVar11 = std::vector<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>::operator[]
                        (&local_20->xfbBuffers,_i_2);
    if ((pvVar11->contains32BitType & 1U) != 0) {
      pvVar11 = std::vector<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>::operator[]
                          (&this->xfbBuffers,_i_2);
      pvVar11->contains32BitType = true;
    }
    pvVar11 = std::vector<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>::operator[]
                        (&local_20->xfbBuffers,_i_2);
    if ((pvVar11->contains16BitType & 1U) != 0) {
      pvVar11 = std::vector<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>::operator[]
                          (&this->xfbBuffers,_i_2);
      pvVar11->contains16BitType = true;
    }
  }
  if ((local_20->multiStream & 1U) != 0) {
    this->multiStream = (bool)(local_20->multiStream & 1);
  }
  if ((local_20->layoutOverrideCoverage & 1U) != 0) {
    this->layoutOverrideCoverage = (bool)(local_20->layoutOverrideCoverage & 1);
  }
  if ((local_20->geoPassthroughEXT & 1U) != 0) {
    this->geoPassthroughEXT = (bool)(local_20->geoPassthroughEXT & 1);
  }
  for (it._M_node._4_4_ = EResSampler; uVar13 = (ulong)it._M_node._4_4_,
      sVar10 = std::array<unsigned_int,_6UL>::size(&local_20->shiftBinding), uVar13 < sVar10;
      it._M_node._4_4_ = it._M_node._4_4_ + EResTexture) {
    pvVar14 = std::array<unsigned_int,_6UL>::operator[]
                        (&local_20->shiftBinding,(ulong)it._M_node._4_4_);
    TVar2 = it._M_node._4_4_;
    if (*pvVar14 != 0) {
      pvVar14 = std::array<unsigned_int,_6UL>::operator[]
                          (&local_20->shiftBinding,(ulong)it._M_node._4_4_);
      setShiftBinding(this,TVar2,*pvVar14);
    }
  }
  for (it._M_node._0_4_ = EResSampler; uVar13 = (ulong)(TResourceType)it._M_node,
      sVar10 = std::
               array<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_6UL>
               ::size(&local_20->shiftBindingForSet), uVar13 < sVar10;
      it._M_node._0_4_ = (TResourceType)it._M_node + EResTexture) {
    pvVar15 = std::
              array<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_6UL>
              ::operator[](&local_20->shiftBindingForSet,(ulong)(TResourceType)it._M_node);
    local_58._M_node =
         (_Base_ptr)
         std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::begin
                   (pvVar15);
    while( true ) {
      pvVar15 = std::
                array<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_6UL>
                ::operator[](&local_20->shiftBindingForSet,(ulong)(TResourceType)it._M_node);
      local_60._M_node =
           (_Base_ptr)
           std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end
                     (pvVar15);
      bVar4 = std::operator!=(&local_58,&local_60);
      TVar2 = (TResourceType)it._M_node;
      if (!bVar4) break;
      ppVar16 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->(&local_58);
      uVar1 = ppVar16->second;
      ppVar16 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->(&local_58);
      setShiftBindingForSet(this,TVar2,uVar1,ppVar16->first);
      std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator++(&local_58);
    }
  }
  local_70._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&this->resourceSetBinding);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&local_68,&local_70);
  __first = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::begin(&local_20->resourceSetBinding);
  __last = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&local_20->resourceSetBinding);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->resourceSetBinding,local_68,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )__first._M_current,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )__last._M_current);
  if ((local_20->autoMapBindings & 1U) != 0) {
    this->autoMapBindings = (bool)(local_20->autoMapBindings & 1);
  }
  if ((local_20->autoMapLocations & 1U) != 0) {
    this->autoMapLocations = (bool)(local_20->autoMapLocations & 1);
  }
  if ((local_20->invertY & 1U) != 0) {
    this->invertY = (bool)(local_20->invertY & 1);
  }
  if ((local_20->dxPositionW & 1U) != 0) {
    this->dxPositionW = (bool)(local_20->dxPositionW & 1);
  }
  if ((local_20->debugInfo & 1U) != 0) {
    this->debugInfo = (bool)(local_20->debugInfo & 1);
  }
  if ((local_20->flattenUniformArrays & 1U) != 0) {
    this->flattenUniformArrays = (bool)(local_20->flattenUniformArrays & 1);
  }
  if ((local_20->useUnknownFormat & 1U) != 0) {
    this->useUnknownFormat = (bool)(local_20->useUnknownFormat & 1);
  }
  if ((local_20->hlslOffsets & 1U) != 0) {
    this->hlslOffsets = (bool)(local_20->hlslOffsets & 1);
  }
  if ((local_20->useStorageBuffer & 1U) != 0) {
    this->useStorageBuffer = (bool)(local_20->useStorageBuffer & 1);
  }
  if ((local_20->invariantAll & 1U) != 0) {
    this->invariantAll = (bool)(local_20->invariantAll & 1);
  }
  if ((local_20->hlslIoMapping & 1U) != 0) {
    this->hlslIoMapping = (bool)(local_20->hlslIoMapping & 1);
  }
  if ((local_20->needToLegalize & 1U) != 0) {
    this->needToLegalize = (bool)(local_20->needToLegalize & 1);
  }
  if ((local_20->binaryDoubleOutput & 1U) != 0) {
    this->binaryDoubleOutput = (bool)(local_20->binaryDoubleOutput & 1);
  }
  if ((local_20->usePhysicalStorageBuffer & 1U) != 0) {
    this->usePhysicalStorageBuffer = (bool)(local_20->usePhysicalStorageBuffer & 1);
  }
  return;
}

Assistant:

void TIntermediate::mergeModes(TInfoSink& infoSink, TIntermediate& unit)
{
    if (language != unit.language)
        error(infoSink, "stages must match when linking into a single stage");

    if (getSource() == EShSourceNone)
        setSource(unit.getSource());
    if (getSource() != unit.getSource())
        error(infoSink, "can't link compilation units from different source languages");

    if (treeRoot == nullptr) {
        profile = unit.profile;
        version = unit.version;
        requestedExtensions = unit.requestedExtensions;
    } else {
        if ((isEsProfile()) != (unit.isEsProfile()))
            error(infoSink, "Cannot cross link ES and desktop profiles");
        else if (unit.profile == ECompatibilityProfile)
            profile = ECompatibilityProfile;
        version = std::max(version, unit.version);
        requestedExtensions.insert(unit.requestedExtensions.begin(), unit.requestedExtensions.end());
    }

    MERGE_MAX(spvVersion.spv);
    MERGE_MAX(spvVersion.vulkanGlsl);
    MERGE_MAX(spvVersion.vulkan);
    MERGE_MAX(spvVersion.openGl);
    MERGE_TRUE(spvVersion.vulkanRelaxed);

    numErrors += unit.getNumErrors();
    // Only one push_constant is allowed, mergeLinkerObjects() will ensure the push_constant
    // is the same for all units.
    if (numPushConstants > 1 || unit.numPushConstants > 1)
        error(infoSink, "Only one push_constant block is allowed per stage");
    numPushConstants = std::min(numPushConstants + unit.numPushConstants, 1);

    if (unit.invocations != TQualifier::layoutNotSet) {
        if (invocations == TQualifier::layoutNotSet)
            invocations = unit.invocations;
        else if (invocations != unit.invocations)
            error(infoSink, "number of invocations must match between compilation units");
    }

    if (vertices == TQualifier::layoutNotSet)
        vertices = unit.vertices;
    else if (unit.vertices != TQualifier::layoutNotSet && vertices != unit.vertices) {
        if (language == EShLangGeometry || language == EShLangMesh)
            error(infoSink, "Contradictory layout max_vertices values");
        else if (language == EShLangTessControl)
            error(infoSink, "Contradictory layout vertices values");
        else
            assert(0);
    }
    if (primitives == TQualifier::layoutNotSet)
        primitives = unit.primitives;
    else if (primitives != unit.primitives) {
        if (language == EShLangMesh)
            error(infoSink, "Contradictory layout max_primitives values");
        else
            assert(0);
    }

    if (inputPrimitive == ElgNone)
        inputPrimitive = unit.inputPrimitive;
    else if (unit.inputPrimitive != ElgNone && inputPrimitive != unit.inputPrimitive)
        error(infoSink, "Contradictory input layout primitives");

    if (outputPrimitive == ElgNone)
        outputPrimitive = unit.outputPrimitive;
    else if (unit.outputPrimitive != ElgNone && outputPrimitive != unit.outputPrimitive)
        error(infoSink, "Contradictory output layout primitives");

    if (originUpperLeft != unit.originUpperLeft || pixelCenterInteger != unit.pixelCenterInteger)
        error(infoSink, "gl_FragCoord redeclarations must match across shaders");

    if (vertexSpacing == EvsNone)
        vertexSpacing = unit.vertexSpacing;
    else if (vertexSpacing != unit.vertexSpacing)
        error(infoSink, "Contradictory input vertex spacing");

    if (vertexOrder == EvoNone)
        vertexOrder = unit.vertexOrder;
    else if (vertexOrder != unit.vertexOrder)
        error(infoSink, "Contradictory triangle ordering");

    MERGE_TRUE(pointMode);

    for (int i = 0; i < 3; ++i) {
        if (unit.localSizeNotDefault[i]) {
            if (!localSizeNotDefault[i]) {
                localSize[i] = unit.localSize[i];
                localSizeNotDefault[i] = true;
            }
            else if (localSize[i] != unit.localSize[i])
                error(infoSink, "Contradictory local size");
        }

        if (localSizeSpecId[i] == TQualifier::layoutNotSet)
            localSizeSpecId[i] = unit.localSizeSpecId[i];
        else if (localSizeSpecId[i] != unit.localSizeSpecId[i])
            error(infoSink, "Contradictory local size specialization ids");
    }

    MERGE_TRUE(earlyFragmentTests);
    MERGE_TRUE(postDepthCoverage);
    MERGE_TRUE(nonCoherentColorAttachmentReadEXT);
    MERGE_TRUE(nonCoherentDepthAttachmentReadEXT);
    MERGE_TRUE(nonCoherentStencilAttachmentReadEXT);

    if (depthLayout == EldNone)
        depthLayout = unit.depthLayout;
    else if (depthLayout != unit.depthLayout)
        error(infoSink, "Contradictory depth layouts");

    MERGE_TRUE(depthReplacing);
    MERGE_TRUE(hlslFunctionality1);

    blendEquations |= unit.blendEquations;

    MERGE_TRUE(xfbMode);

    for (size_t b = 0; b < xfbBuffers.size(); ++b) {
        if (xfbBuffers[b].stride == TQualifier::layoutXfbStrideEnd)
            xfbBuffers[b].stride = unit.xfbBuffers[b].stride;
        else if (xfbBuffers[b].stride != unit.xfbBuffers[b].stride)
            error(infoSink, "Contradictory xfb_stride");
        xfbBuffers[b].implicitStride = std::max(xfbBuffers[b].implicitStride, unit.xfbBuffers[b].implicitStride);
        if (unit.xfbBuffers[b].contains64BitType)
            xfbBuffers[b].contains64BitType = true;
        if (unit.xfbBuffers[b].contains32BitType)
            xfbBuffers[b].contains32BitType = true;
        if (unit.xfbBuffers[b].contains16BitType)
            xfbBuffers[b].contains16BitType = true;
        // TODO: 4.4 link: enhanced layouts: compare ranges
    }

    MERGE_TRUE(multiStream);
    MERGE_TRUE(layoutOverrideCoverage);
    MERGE_TRUE(geoPassthroughEXT);

    for (unsigned int i = 0; i < unit.shiftBinding.size(); ++i) {
        if (unit.shiftBinding[i] > 0)
            setShiftBinding((TResourceType)i, unit.shiftBinding[i]);
    }

    for (unsigned int i = 0; i < unit.shiftBindingForSet.size(); ++i) {
        for (auto it = unit.shiftBindingForSet[i].begin(); it != unit.shiftBindingForSet[i].end(); ++it)
            setShiftBindingForSet((TResourceType)i, it->second, it->first);
    }

    resourceSetBinding.insert(resourceSetBinding.end(), unit.resourceSetBinding.begin(), unit.resourceSetBinding.end());

    MERGE_TRUE(autoMapBindings);
    MERGE_TRUE(autoMapLocations);
    MERGE_TRUE(invertY);
    MERGE_TRUE(dxPositionW);
    MERGE_TRUE(debugInfo);
    MERGE_TRUE(flattenUniformArrays);
    MERGE_TRUE(useUnknownFormat);
    MERGE_TRUE(hlslOffsets);
    MERGE_TRUE(useStorageBuffer);
    MERGE_TRUE(invariantAll);
    MERGE_TRUE(hlslIoMapping);

    // TODO: sourceFile
    // TODO: sourceText
    // TODO: processes

    MERGE_TRUE(needToLegalize);
    MERGE_TRUE(binaryDoubleOutput);
    MERGE_TRUE(usePhysicalStorageBuffer);
}